

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool Fossilize::StreamArchive::find_entry_from_metadata
               (ExportedMetadataHeader *header,ResourceTag tag,Hash hash,Entry *entry)

{
  Hash HVar1;
  Hash HVar2;
  ulong uVar3;
  Hash *pHVar4;
  Hash *pHVar5;
  difference_type __d;
  ulong uVar6;
  
  uVar6 = header->lists[tag].count;
  if (uVar6 != 0) {
    pHVar5 = (Hash *)((long)&((ExportedMetadataHeader *)(header->lists + -1))->magic +
                     header->lists[tag].offset);
    pHVar4 = pHVar5 + uVar6 * 4;
    while (uVar3 = uVar6, 0 < (long)uVar3) {
      uVar6 = uVar3 >> 1;
      if (pHVar5[uVar6 * 4] < hash) {
        pHVar5 = pHVar5 + uVar6 * 4 + 4;
        uVar6 = ~uVar6 + uVar3;
      }
    }
    if ((pHVar5 != pHVar4) && (*pHVar5 == hash)) {
      if (entry != (Entry *)0x0) {
        entry->offset = pHVar5[1];
        HVar1 = pHVar5[2];
        HVar2 = pHVar5[3];
        (entry->header).payload_size = (int)HVar1;
        (entry->header).format = (int)(HVar1 >> 0x20);
        (entry->header).crc = (int)HVar2;
        (entry->header).uncompressed_size = (int)(HVar2 >> 0x20);
      }
      return true;
    }
  }
  return false;
}

Assistant:

static bool find_entry_from_metadata(const ExportedMetadataHeader *header, ResourceTag tag, Hash hash, Entry *entry)
	{
		size_t count = header->lists[tag].count;
		if (!count)
			return false;

		// Binary search in-place.
		auto *blocks = reinterpret_cast<const ExportedMetadataBlock *>(
				reinterpret_cast<const uint8_t *>(header) + header->lists[tag].offset);

		auto itr = std::lower_bound(blocks, blocks + count, hash, [](const ExportedMetadataBlock &a, Hash hash_) {
			return a.hash < hash_;
		});

		if (itr != blocks + count && itr->hash == hash)
		{
			if (entry)
			{
				entry->offset = itr->file_offset;
				entry->header = itr->payload;
			}
			return true;
		}
		else
			return false;
	}